

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm-sync-common.c
# Opt level: O0

int create_segment(Arguments *args)

{
  int iVar1;
  int *in_RDI;
  int size;
  key_t segment_key;
  int segment_id;
  
  iVar1 = generate_key((char *)0x102675);
  iVar1 = shmget(iVar1,(long)(*in_RDI + 0x58),0x3b6);
  if (iVar1 < 0) {
    throw((char *)0x1026b3);
  }
  return iVar1;
}

Assistant:

int create_segment(struct Arguments* args) {
	// The identifier for the shared memory segment
	int segment_id;

	// Key for the memory segment
	key_t segment_key = generate_key("shm");

	// The size for the segment
	int size = args->size + sizeof(*(struct Sync*)0);

	/*
		The call that actually allocates the shared memory segment.
		Arguments:
			1. The shared memory key. This must be unique across the OS.
			2. The number of bytes to allocate. This will be rounded up to the OS'
				 pages size for alignment purposes.
			3. The creation flags and permission bits, where:
				 - IPC_CREAT means that a new segment is to be created
				 - IPC_EXCL means that the call will fail if
					 the segment-key is already taken (removed)
				 - 0666 means read + write permission for user, group and world.
		When the shared memory key already exists, this call will fail. To see
		which keys are currently in use, and to remove a certain segment, you
		can use the following shell commands:
			- Use `ipcs -m` to show shared memory segments and their IDs
			- Use `ipcrm -m <segment_id>` to remove/deallocate a shared memory segment
	*/
	segment_id = shmget(segment_key, size, IPC_CREAT | 0666);

	if (segment_id < 0) {
		throw("Error allocating segment");
	}

	return segment_id;
}